

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackOverflowQueryTests.cpp
# Opt level: O1

bool __thiscall
gl3cts::TransformFeedbackOverflowQueryContextStateBase::verifyCurrentQueryState
          (TransformFeedbackOverflowQueryContextStateBase *this,GLenum target,GLuint index,
          GLuint value)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  GLint actual;
  GLuint local_2c;
  
  iVar2 = (*((this->super_TransformFeedbackOverflowQueryBaseTest).super_TestCase.m_context)->
            m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0xa00))(target,index,0x8865,&local_2c);
  if (local_2c == value) {
    if (index == 0) {
      (**(code **)(CONCAT44(extraout_var,iVar2) + 0xa28))(target,0x8865,&local_2c);
      if (local_2c != value) goto LAB_0086e648;
    }
    bVar1 = true;
  }
  else {
LAB_0086e648:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool verifyCurrentQueryState(GLenum target, GLuint index, GLuint value)
	{
		const glw::Functions& gl	   = m_context.getRenderContext().getFunctions();
		GLint				  expected = (GLint)value;
		GLint				  actual;

		// Use GetQueryIndexediv by default
		gl.getQueryIndexediv(target, index, GL_CURRENT_QUERY, &actual);
		if (actual != expected)
		{
			return false;
		}

		if (index == 0)
		{
			// If index is zero then GetQueryiv should also return the expected value
			gl.getQueryiv(target, GL_CURRENT_QUERY, &actual);
			if (actual != expected)
			{
				return false;
			}
		}

		return true;
	}